

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fast_math.cpp
# Opt level: O0

float fast_pow(float x,int y)

{
  float fVar1;
  float temp;
  int y_local;
  float x_local;
  
  if (y == 0) {
    y_local = 0x3f800000;
  }
  else {
    fVar1 = fast_pow(x,y / 2);
    if (y % 2 == 0) {
      y_local = (int)(fVar1 * fVar1);
    }
    else {
      y_local = (int)(x * fVar1 * fVar1);
    }
  }
  return (float)y_local;
}

Assistant:

float fast_pow(float x, int y){
    float temp;
    if(y==0) return 1; //base case

    //recursion
    temp = fast_pow(x, y/2);
    if(y%2==0) return temp*temp;
    else return x*temp*temp;
}